

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O0

ScalarFunction * duckdb::StructDatePart::GetFunction<duckdb::date_t>(LogicalType *temporal_type)

{
  initializer_list<duckdb::LogicalType> iVar1;
  LogicalType *in_RSI;
  ScalarFunction *in_RDI;
  LogicalType result_type;
  LogicalType part_type;
  ScalarFunction *result;
  allocator_type *in_stack_fffffffffffffe18;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffe20;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  LogicalType *local_178;
  LogicalType local_148 [24];
  undefined1 local_130 [32];
  LogicalType local_110 [32];
  LogicalType *local_f0;
  LogicalType local_e8 [24];
  LogicalType local_d0 [24];
  LogicalType *local_b8;
  undefined8 local_b0;
  undefined1 local_a8 [31];
  undefined1 local_89;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  LogicalType local_68 [40];
  LogicalType local_40 [24];
  LogicalType local_28 [24];
  LogicalType *local_10;
  
  local_10 = in_RSI;
  duckdb::LogicalType::LogicalType(local_40,VARCHAR);
  duckdb::LogicalType::LIST(local_28);
  duckdb::LogicalType::~LogicalType(local_40);
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
            *)0xc21d44);
  duckdb::LogicalType::STRUCT(local_68,&local_88);
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
             *)0xc21d68);
  local_89 = 0;
  local_f0 = local_e8;
  duckdb::LogicalType::LogicalType(local_f0,local_28);
  local_f0 = local_d0;
  duckdb::LogicalType::LogicalType(local_f0,local_10);
  local_b8 = local_e8;
  local_b0 = 2;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xc21ddc);
  iVar1._M_len._0_4_ = in_stack_fffffffffffffe30;
  iVar1._M_array = (iterator)in_stack_fffffffffffffe28;
  iVar1._M_len._4_4_ = in_stack_fffffffffffffe34;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffe20,iVar1,in_stack_fffffffffffffe18);
  duckdb::LogicalType::LogicalType(local_110,local_68);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),in_stack_fffffffffffffe28
            );
  duckdb::LogicalType::LogicalType(local_148,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (in_RDI,local_a8,local_110,local_130,Bind,0,0,0,local_148,0,0,0);
  duckdb::LogicalType::~LogicalType(local_148);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xc21ebd);
  duckdb::LogicalType::~LogicalType(local_110);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xc21ed7);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xc21ee4);
  local_178 = (LogicalType *)&local_b8;
  do {
    local_178 = local_178 + -0x18;
    duckdb::LogicalType::~LogicalType(local_178);
  } while (local_178 != local_e8);
  in_RDI->serialize = SerializeFunction;
  in_RDI->deserialize = DeserializeFunction;
  local_89 = 1;
  duckdb::LogicalType::~LogicalType(local_68);
  duckdb::LogicalType::~LogicalType(local_28);
  return in_RDI;
}

Assistant:

static ScalarFunction GetFunction(const LogicalType &temporal_type) {
		auto part_type = LogicalType::LIST(LogicalType::VARCHAR);
		auto result_type = LogicalType::STRUCT({});
		ScalarFunction result({part_type, temporal_type}, result_type, Function<INPUT_TYPE>, Bind);
		result.serialize = SerializeFunction;
		result.deserialize = DeserializeFunction;
		return result;
	}